

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::DynamicMapField::SyncRepeatedFieldWithMapNoLock(DynamicMapField *this)

{
  pointer pcVar1;
  double value;
  Node *pNVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  int32_t iVar6;
  undefined4 extraout_var;
  FieldDescriptor *field;
  undefined4 extraout_var_00;
  FieldDescriptor *field_00;
  RepeatedPtrField<google::protobuf::Message> *pRVar7;
  undefined4 extraout_var_01;
  LogMessage *other;
  uint64_t uVar8;
  string *psVar9;
  int64_t iVar10;
  Message *pMVar11;
  Message *pMVar12;
  Reflection *this_00;
  undefined1 *this_01;
  float value_00;
  const_iterator it;
  FieldDescriptor *local_d0;
  iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
  local_c8;
  FieldDescriptor *local_b0;
  string local_a8;
  string local_88;
  Node *local_68;
  InnerMap *pIStack_60;
  
  (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x11])();
  iVar4 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x11])();
  field = Descriptor::map_key((Descriptor *)CONCAT44(extraout_var,iVar4));
  iVar4 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x11])();
  field_00 = Descriptor::map_value((Descriptor *)CONCAT44(extraout_var_00,iVar4));
  if ((this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
      .super_MapFieldBase.repeated_field_ == (RepeatedPtrField<google::protobuf::Message> *)0x0) {
    pRVar7 = Arena::
             CreateMessageInternal<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
    super_MapFieldBase.repeated_field_ = pRVar7;
  }
  RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
            (&((this->
               super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
               ).super_MapFieldBase.repeated_field_)->super_RepeatedPtrFieldBase);
  pIStack_60 = &(this->map_).elements_;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
  iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
  ::SearchFrom((iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
                *)&local_68,(this->map_).elements_.index_of_first_non_null_);
  local_b0 = field;
  local_c8.m_ = pIStack_60;
  local_c8.node_ = local_68;
  while (local_c8.node_ != (Node *)0x0) {
    iVar4 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[3])
                      (this->default_entry_,
                       (this->
                       super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                       ).super_MapFieldBase.arena_);
    pMVar12 = (Message *)CONCAT44(extraout_var_01,iVar4);
    RepeatedPtrFieldBase::
    AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
              (&((this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.repeated_field_)->super_RepeatedPtrFieldBase,pMVar12);
    pNVar2 = local_c8.node_;
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_68 = (Node *)FieldDescriptor::TypeOnceInit;
      local_d0 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_68,
                 &local_d0);
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4)) {
    case 1:
      iVar6 = MapKey::GetInt32Value((MapKey *)pNVar2);
      Reflection::SetInt32(this_00,pMVar12,field,iVar6);
      break;
    case 2:
      iVar10 = MapKey::GetInt64Value((MapKey *)pNVar2);
      Reflection::SetInt64(this_00,pMVar12,field,iVar10);
      break;
    case 3:
      uVar5 = MapKey::GetUInt32Value((MapKey *)pNVar2);
      Reflection::SetUInt32(this_00,pMVar12,field,uVar5);
      break;
    case 4:
      uVar8 = MapKey::GetUInt64Value((MapKey *)pNVar2);
      Reflection::SetUInt64(this_00,pMVar12,field,uVar8);
      break;
    case 5:
    case 6:
    case 8:
    case 10:
      LogMessage::LogMessage
                ((LogMessage *)&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.cc"
                 ,0x1d8);
      other = LogMessage::operator<<((LogMessage *)&local_68,"Can\'t get here.");
      LogFinisher::operator=((LogFinisher *)&local_d0,other);
      LogMessage::~LogMessage((LogMessage *)&local_68);
      break;
    case 7:
      bVar3 = MapKey::GetBoolValue((MapKey *)pNVar2);
      Reflection::SetBool(this_00,pMVar12,field,bVar3);
      break;
    case 9:
      psVar9 = MapKey::GetStringValue_abi_cxx11_((MapKey *)pNVar2);
      pcVar1 = (psVar9->_M_dataplus)._M_p;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar1,pcVar1 + psVar9->_M_string_length);
      Reflection::SetString(this_00,pMVar12,field,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
    pNVar2 = local_c8.node_;
    if (*(once_flag **)(field_00 + 0x18) != (once_flag *)0x0) {
      local_68 = (Node *)FieldDescriptor::TypeOnceInit;
      local_d0 = field_00;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field_00 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_68,
                 &local_d0);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field_00[2] * 4) - 1U < 10) {
      this_01 = &pNVar2->field_0x28;
      switch(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field_00[2] * 4)) {
      case 1:
        iVar6 = MapValueConstRef::GetInt32Value((MapValueConstRef *)this_01);
        Reflection::SetInt32(this_00,pMVar12,field_00,iVar6);
        break;
      case 2:
        iVar10 = MapValueConstRef::GetInt64Value((MapValueConstRef *)this_01);
        Reflection::SetInt64(this_00,pMVar12,field_00,iVar10);
        break;
      case 3:
        uVar5 = MapValueConstRef::GetUInt32Value((MapValueConstRef *)this_01);
        Reflection::SetUInt32(this_00,pMVar12,field_00,uVar5);
        break;
      case 4:
        uVar8 = MapValueConstRef::GetUInt64Value((MapValueConstRef *)this_01);
        Reflection::SetUInt64(this_00,pMVar12,field_00,uVar8);
        break;
      case 5:
        value = MapValueConstRef::GetDoubleValue((MapValueConstRef *)this_01);
        Reflection::SetDouble(this_00,pMVar12,field_00,value);
        break;
      case 6:
        value_00 = MapValueConstRef::GetFloatValue((MapValueConstRef *)this_01);
        Reflection::SetFloat(this_00,pMVar12,field_00,value_00);
        break;
      case 7:
        bVar3 = MapValueConstRef::GetBoolValue((MapValueConstRef *)this_01);
        Reflection::SetBool(this_00,pMVar12,field_00,bVar3);
        break;
      case 8:
        iVar4 = MapValueConstRef::GetEnumValue((MapValueConstRef *)this_01);
        Reflection::SetEnumValue(this_00,pMVar12,field_00,iVar4);
        break;
      case 9:
        psVar9 = MapValueConstRef::GetStringValue_abi_cxx11_((MapValueConstRef *)this_01);
        pcVar1 = (psVar9->_M_dataplus)._M_p;
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,pcVar1,pcVar1 + psVar9->_M_string_length);
        Reflection::SetString(this_00,pMVar12,field_00,&local_a8);
        field = local_b0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        break;
      case 10:
        pMVar11 = MapValueConstRef::GetMessageValue((MapValueConstRef *)this_01);
        pMVar12 = Reflection::MutableMessage(this_00,pMVar12,field_00,(MessageFactory *)0x0);
        (*(pMVar12->super_MessageLite)._vptr_MessageLite[0xd])(pMVar12,pMVar11);
      }
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
    ::operator++(&local_c8);
  }
  return;
}

Assistant:

void DynamicMapField::SyncRepeatedFieldWithMapNoLock() const {
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des = default_entry_->GetDescriptor()->map_key();
  const FieldDescriptor* val_des = default_entry_->GetDescriptor()->map_value();
  if (MapFieldBase::repeated_field_ == nullptr) {
    MapFieldBase::repeated_field_ =
        Arena::CreateMessage<RepeatedPtrField<Message> >(MapFieldBase::arena_);
  }

  MapFieldBase::repeated_field_->Clear();

  for (Map<MapKey, MapValueRef>::const_iterator it = map_.begin();
       it != map_.end(); ++it) {
    Message* new_entry = default_entry_->New(MapFieldBase::arena_);
    MapFieldBase::repeated_field_->AddAllocated(new_entry);
    const MapKey& map_key = it->first;
    switch (key_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        reflection->SetString(new_entry, key_des, map_key.GetStringValue());
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        reflection->SetInt64(new_entry, key_des, map_key.GetInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        reflection->SetInt32(new_entry, key_des, map_key.GetInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        reflection->SetUInt64(new_entry, key_des, map_key.GetUInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        reflection->SetUInt32(new_entry, key_des, map_key.GetUInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        reflection->SetBool(new_entry, key_des, map_key.GetBoolValue());
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }
    const MapValueRef& map_val = it->second;
    switch (val_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        reflection->SetString(new_entry, val_des, map_val.GetStringValue());
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        reflection->SetInt64(new_entry, val_des, map_val.GetInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        reflection->SetInt32(new_entry, val_des, map_val.GetInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        reflection->SetUInt64(new_entry, val_des, map_val.GetUInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        reflection->SetUInt32(new_entry, val_des, map_val.GetUInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        reflection->SetBool(new_entry, val_des, map_val.GetBoolValue());
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
        reflection->SetDouble(new_entry, val_des, map_val.GetDoubleValue());
        break;
      case FieldDescriptor::CPPTYPE_FLOAT:
        reflection->SetFloat(new_entry, val_des, map_val.GetFloatValue());
        break;
      case FieldDescriptor::CPPTYPE_ENUM:
        reflection->SetEnumValue(new_entry, val_des, map_val.GetEnumValue());
        break;
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = map_val.GetMessageValue();
        reflection->MutableMessage(new_entry, val_des)->CopyFrom(message);
        break;
      }
    }
  }
}